

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void nh_timeout(void)

{
  monst *pmVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  int tmp;
  uint uVar13;
  long lVar14;
  char *line;
  bool bVar15;
  char local_138 [264];
  
  uVar13 = -(uint)(flags.moonphase != 4);
  if (flags.friday13 == '\0') {
    uVar13 = (uint)(flags.moonphase == 4);
  }
  if (uVar13 != (int)u.uluck) {
    uVar6 = 600;
    if (u.ugangr != 0) {
      uVar6 = 300;
    }
    if ((u.uhave._0_1_ & 1) != 0) {
      uVar6 = 300;
    }
    if (moves % uVar6 == 0) {
      bVar15 = false;
      iVar4 = stone_luck('\0');
      poVar8 = carrying(0x20f);
      if (poVar8 == (obj *)0x0) {
        iVar5 = stone_luck('\x01');
        bVar15 = iVar5 == 0;
      }
      cVar2 = -1;
      if (((bool)((int)uVar13 < (int)u.uluck & (iVar4 < 0 | bVar15))) ||
         (cVar2 = '\x01', (bool)((bVar15 | 0 < iVar4) & (int)u.uluck < (int)uVar13))) {
        u.uluck = u.uluck + cVar2;
      }
    }
  }
  if (u.uprops[0x3e].intrinsic == 1) {
    pcVar10 = "Your body is solid again.";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar10 = "You feel totally separated from the spirit world.";
      }
      else {
        cVar2 = dmgtype(youmonst.data,0x24);
        pcVar9 = "You feel totally separated from the spirit world.";
        pcVar10 = "Your body is solid again.";
LAB_0025b6c9:
        if (cVar2 == '\0') {
          pcVar10 = pcVar9;
        }
      }
    }
LAB_0025b6cd:
    pline(pcVar10);
    stop_occupation();
  }
  else if (u.uprops[0x3e].intrinsic == 0xf) {
    pcVar10 = "Your body is beginning to feel more solid.";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum != u.umonster) {
        cVar2 = dmgtype(youmonst.data,0x24);
        pcVar9 = "You feel more distant from the spirit world.";
        pcVar10 = "Your body is beginning to feel more solid.";
        goto LAB_0025b6c9;
      }
      pcVar10 = "You feel more distant from the spirit world.";
    }
    goto LAB_0025b6cd;
  }
  if ((u._1052_1_ & 0x10) != 0) {
    return;
  }
  if (u.uprops[0x21].intrinsic != 0) {
    uVar13 = u.uprops[0x21].intrinsic & 0xffffff;
    if (uVar13 - 1 < 5) {
      pline(stoned_texts_rel + *(int *)(stoned_texts_rel + (5 - uVar13) * 4));
      nomul(0,(char *)0x0);
    }
    if (uVar13 == 3) {
      nomul(-3,"getting stoned");
    }
    else if (uVar13 == 5) {
      u.uprops[0x1a].intrinsic = 0;
    }
    exercise(3,'\0');
  }
  if (u.uprops[0x3a].intrinsic != 0) {
    uVar13 = (u.uprops[0x3a].intrinsic & 0xffffff) >> 1;
    if ((u.uprops[0x3a].intrinsic & 0xffffff) < 10 && (u.uprops[0x3a].intrinsic & 1) != 0) {
      pcVar10 = slime_texts[4 - (ulong)uVar13];
      pcVar9 = strchr(pcVar10,0x25);
      if (pcVar9 == (char *)0x0) {
        pline(pcVar10);
      }
      else {
        if (uVar13 == 4) {
          if (((u.uprops[0x1e].intrinsic != 0) ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_0025b8a0;
          hcolor("green");
        }
        else {
          pcVar9 = "green slime";
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))) {
            pcVar9 = rndmonnam();
          }
          an(pcVar9);
        }
        pline(pcVar10);
      }
    }
LAB_0025b8a0:
    if (uVar13 == 3) {
      u.uprops[0x1a].intrinsic = 0;
      stop_occupation();
      if (0 < multi) {
        nomul(0,(char *)0x0);
      }
    }
    exercise(3,'\0');
  }
  if (u.uprops[0x2f].intrinsic != 0) {
    uVar13 = u.uprops[0x2f].intrinsic & 0xffffff;
    uVar12 = (ulong)uVar13 / 3;
    if ((uVar13 < 0xf) && ((ulong)uVar13 % 3 == 2)) {
      pline(vomiting_texts_rel + *(int *)(vomiting_texts_rel + (4 - uVar12) * 4));
    }
    uVar13 = u.uprops[0x1b].intrinsic;
    if (uVar12 == 3) {
LAB_0025b97f:
      uVar13 = u.uprops[0x1c].intrinsic;
      iVar4 = 2;
      iVar5 = -2;
      do {
        uVar6 = mt_random();
        iVar4 = iVar4 + (uVar6 & 3);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      make_confused((ulong)(iVar4 + uVar13),'\0');
    }
    else {
      if ((int)uVar12 == 2) {
        iVar4 = 2;
        iVar5 = -2;
        do {
          uVar6 = mt_random();
          iVar4 = iVar4 + (uVar6 & 3);
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0);
        make_stunned((ulong)(iVar4 + uVar13),'\0');
        goto LAB_0025b97f;
      }
      if ((int)uVar12 == 0) {
        vomit();
        morehungry(0x14);
      }
    }
    exercise(4,'\0');
  }
  if (u.uprops[0x22].intrinsic == 0) goto LAB_0025ba84;
  uVar13 = u.uprops[0x22].intrinsic & 0xffffff;
  if (uVar13 - 1 < 5) {
    if (((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
        (((youmonst.data)->mflags1 & 0x400) == 0)) &&
       (uVar6 = mt_random(),
       0x51eb851 < (uVar6 * -0x3d70a3d7 >> 1 | (uint)((uVar6 * -0x3d70a3d7 & 1) != 0) << 0x1f))) {
      pcVar10 = *(char **)((long)choke_texts + (ulong)((5 - uVar13) * 8));
      pcVar9 = strchr(pcVar10,0x25);
      if (pcVar9 == (char *)0x0) {
        pline(pcVar10);
        goto LAB_0025ba7b;
      }
      hcolor("blue");
    }
    else {
      pcVar10 = choke_texts2_rel + *(int *)(choke_texts2_rel + (5 - uVar13) * 4);
      body_part(0xb);
    }
    pline(pcVar10);
  }
LAB_0025ba7b:
  exercise(0,'\0');
LAB_0025ba84:
  if ((u.mtimedone != 0) && (u.mtimedone = u.mtimedone + -1, u.mtimedone == 0)) {
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      rehumanize();
    }
    else {
      cVar2 = (youmonst.data)->mlevel;
      uVar13 = mt_random();
      u.mtimedone = SUB164(ZEXT416(uVar13) % SEXT816((long)cVar2 * 100 + 1),0) + 1;
    }
  }
  if (u.ucreamed != 0) {
    u.ucreamed = u.ucreamed - 1;
  }
  if ((u.usptime != '\0') &&
     (u.usptime = u.usptime + 0xff, u.uspellprot != '\0' && u.usptime == '\0')) {
    u.usptime = u.uspmtime;
    u.uspellprot = u.uspellprot + 0xff;
    find_ac();
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar10 = hcolor("golden");
      pcVar9 = "becomes less dense";
      if (u.uspellprot == '\0') {
        pcVar9 = "disappears";
      }
      Norep("The %s haze around you %s.",pcVar10,pcVar9);
    }
  }
  if ((u.ugallop != 0) && (u.ugallop = u.ugallop + -1, u.usteed != (monst *)0x0 && u.ugallop == 0))
  {
    Monnam(u.usteed);
    pline("%s stops galloping.");
  }
  uVar12 = 0x319738;
  lVar14 = 0;
  do {
    if (((*(uint *)(uVar12 + 8) & 0xffffff) == 0) ||
       (uVar13 = *(uint *)(uVar12 + 8) - 1, *(uint *)(uVar12 + 8) = uVar13, pmVar1 = u.usteed,
       (uVar13 & 0xffffff) != 0)) goto switchD_0025bc92_caseD_e;
    switch(lVar14) {
    case 0xc:
      set_mimic_blocking();
      see_monsters();
      newsym((int)u.ux,(int)u.uy);
      goto LAB_0025c069;
    case 0xd:
      newsym((int)u.ux,(int)u.uy);
      if ((!(bool)(~((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                     (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
                    u.uprops[0xd].blocked != 0) & 1) && u.uprops[0xd].blocked == 0) &&
         (((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
        pcVar10 = "You can no longer see through yourself.";
        if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
           (pcVar10 = "You can no longer see through yourself.",
           ((youmonst.data)->mflags1 & 0x1000000) == 0)) {
          pcVar10 = "You are no longer invisible.";
        }
        pline(pcVar10);
        goto LAB_0025c069;
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
      break;
    case 0x12:
      float_down(0x10ffffff,0);
      break;
    case 0x1a:
      if ((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0 && u.uprops[0x1a].extrinsic == 0) {
        pline("You feel yourself slowing down%s.");
      }
      break;
    case 0x1b:
      u.uprops[0x1b].intrinsic = 1;
      make_stunned(0,'\x01');
      goto LAB_0025c069;
    case 0x1c:
      u.uprops[0x1c].intrinsic = 1;
      make_confused(0,'\x01');
      goto LAB_0025c069;
    case 0x1d:
      pline("You die from your illness.");
      killer_format = 0;
      killer = u.usick_cause;
      uVar13 = name_to_mon(u.usick_cause);
      if (-1 < (int)uVar13) {
        if ((mons[uVar13].mflags2 & 0x80000) == 0) {
          if ((mons[uVar13].geno & 0x1000) == 0) goto LAB_0025bfb4;
          killer = the(killer);
          strcpy(u.usick_cause,killer);
        }
        killer_format = 1;
      }
LAB_0025bfb4:
      u._971_1_ = u._971_1_ & 0xfc;
      iVar4 = 2;
      goto LAB_0025c14c;
    case 0x1e:
      u.uprops[0x1e].intrinsic = 1;
      make_blinded(0,'\x01');
      goto LAB_0025c069;
    case 0x1f:
      bVar3 = unconscious();
      if ((bVar3 == '\0') &&
         ((((u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0 &&
            (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) ||
          ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0 &&
            ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
           ((((byte)youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))))))) {
        if (u.uprops[0x1f].extrinsic != 0 || u.uprops[0x1f].intrinsic != 0) {
          pline("You fall asleep.");
          uVar13 = 0x14;
          if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
              ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
             (((byte)youmonst.mintrinsics & 4) == 0)) {
            uVar13 = 0x14;
            if (u.uprops[0x38].extrinsic == 0) {
              uVar13 = 10;
            }
          }
          uVar6 = mt_random();
          fall_asleep(~(uVar6 % uVar13),'\x01');
          uVar7 = mt_random();
          u.uprops[0x1f].intrinsic = uVar7 % 100 + uVar6 % uVar13 + u.uprops[0x1f].intrinsic + 2;
        }
      }
      else {
        uVar13 = mt_random();
        u.uprops[0x1f].intrinsic = uVar13 % 100 + u.uprops[0x1f].intrinsic + 1;
      }
      break;
    case 0x20:
      heal_legs();
      goto LAB_0025c069;
    case 0x21:
      if ((delayed_killer != (char *)0x0) && (killer == (char *)0x0)) {
        killer = delayed_killer;
        delayed_killer = (char *)0x0;
      }
      if (killer == (char *)0x0) {
        killer_format = 2;
        killer = "killed by petrification";
      }
      iVar4 = 8;
      goto LAB_0025c14c;
    case 0x22:
      killer_format = 1;
      killer = "suffocation";
      if ((u._1052_1_ & 0x20) == 0) {
        killer = "strangulation";
      }
      iVar4 = 0;
LAB_0025c14c:
      done(iVar4);
      break;
    case 0x23:
      u.uprops[0x23].intrinsic = 1;
      make_hallucinated(0,'\x01',0);
LAB_0025c069:
      stop_occupation();
      break;
    case 0x25:
      if ((((u.umoved != '\0') && (u.uprops[0x12].intrinsic == 0)) &&
          (u.uprops[0x12].extrinsic == 0)) && ((youmonst.data)->mlet != '\x05')) {
        poVar8 = level->objects[u.ux][u.uy];
        if (((poVar8 != (obj *)0x0 && u.usteed == (monst *)0x0) && ((u._1052_1_ & 2) == 0)) &&
           (bVar3 = is_pool(level,(int)u.ux,(int)u.uy), bVar3 != '\0')) {
          poVar8 = (obj *)0x0;
        }
        if (poVar8 == (obj *)0x0 || pmVar1 != (monst *)0x0) {
          uVar13 = mt_random();
          if ((0x55555555 < uVar13 * -0x55555555) &&
             (bVar3 = is_ice(level,(int)u.ux,(int)u.uy), bVar3 != '\0')) {
            pcVar10 = "You";
            if (u.usteed != (monst *)0x0) {
              pcVar10 = x_monnam(u.usteed,(uint)((u.usteed)->mnamelth == '\0'),(char *)0x0,8,'\0');
              pcVar10 = upstart(pcVar10);
            }
            uVar13 = mt_random();
            pcVar9 = "rings slip";
            if ((uVar13 & 1) == 0) {
              pcVar9 = "green slide";
            }
            pcVar9 = pcVar9 + 6;
            pcVar11 = "s";
            if (pmVar1 == (monst *)0x0) {
              pcVar11 = "";
            }
            line = "%s %s%s on the ice.";
            goto LAB_0025c544;
          }
          uVar13 = mt_random();
          if (pmVar1 == (monst *)0x0) {
            switch(uVar13 & 3) {
            case 0:
              pcVar10 = "You stumble.";
              break;
            case 1:
              if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0025c714:
                pcVar10 = body_part(5);
                pcVar10 = makeplural(pcVar10);
              }
              else {
                pcVar10 = "elbow";
                if (u.umonnum != u.umonster) {
                  bVar3 = dmgtype(youmonst.data,0x24);
                  pcVar10 = "elbow";
                  if (bVar3 != '\0') goto LAB_0025c714;
                }
              }
              pcVar9 = "You trip over your own %s.";
              goto LAB_0025c4dc;
            case 2:
              pcVar10 = "and nearly fall";
              if (((u.uprops[0x23].intrinsic != 0) &&
                  (pcVar10 = "and nearly fall", u.uprops[0x24].extrinsic == 0)) &&
                 (pcVar10 = "on a banana peel", u.umonnum != u.umonster)) {
                bVar3 = dmgtype(youmonst.data,0x24);
                pcVar10 = "and nearly fall";
                if (bVar3 == '\0') {
                  pcVar10 = "on a banana peel";
                }
              }
              pcVar9 = "You slip %s.";
              goto LAB_0025c4dc;
            case 3:
              pcVar10 = "You flounder.";
            }
            pline(pcVar10);
            goto LAB_0025c62a;
          }
          switch(uVar13 & 3) {
          case 0:
            pcVar10 = "You slide to one side of the saddle.";
            break;
          case 1:
            pcVar10 = body_part(5);
            pcVar10 = makeplural(pcVar10);
            pline("Your %s slip out of the stirrups.",pcVar10);
            goto LAB_0025c58c;
          case 2:
            pcVar10 = "You let go of the reins.";
            break;
          case 3:
            pcVar10 = "You bang into the saddle-horn.";
          }
          pline(pcVar10);
LAB_0025c58c:
          dismount_steed(1);
        }
        else {
          pcVar10 = "it";
          if (((poVar8->quan != 1) && (pcVar10 = "them", u.uprops[0x23].intrinsic != 0)) &&
             ((pcVar10 = "them", u.uprops[0x24].extrinsic == 0 &&
              (pcVar10 = "they", u.umonnum != u.umonster)))) {
            bVar3 = dmgtype(youmonst.data,0x24);
            pcVar10 = "them";
            if (bVar3 == '\0') {
              pcVar10 = "they";
            }
          }
          if ((poVar8->v).v_nexthere != (obj *)0x0) {
            if ((((poVar8->field_0x4a & 0x20) == 0) &&
                ((u.uprops[0x1e].intrinsic != 0 ||
                 (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)))))) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
              poVar8 = sobj_at(0x213,level,(int)u.ux,(int)u.uy);
              if (poVar8 == (obj *)0x0) {
                poVar8 = (obj *)0x0;
                pcVar10 = "something";
              }
              else {
                pcVar10 = "some rocks";
                if (poVar8->quan == 1) {
                  pcVar10 = "a rock";
                }
              }
            }
            else {
              pcVar10 = doname(poVar8);
            }
          }
          if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
             ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
            pcVar9 = "You trip over %s.";
LAB_0025c4dc:
            pline(pcVar9,pcVar10);
          }
          else {
            strcpy(local_138,pcVar10);
            local_138[0] = highc(local_138[0]);
            pcVar9 = "s";
            if ((poVar8 != (obj *)0x0) && (pcVar9 = "", poVar8->quan == 1)) {
              pcVar9 = "s";
            }
            pcVar11 = body_part(5);
            line = "Egads!  %s bite%s your %s!";
            pcVar10 = local_138;
LAB_0025c544:
            pline(line,pcVar10,pcVar9,pcVar11);
          }
        }
LAB_0025c62a:
        nomul(-2,"fumbling");
        nomovemsg = "";
        iVar4 = inv_weight();
        if (-500 < iVar4) {
          pline("You make a lot of noise!");
          wake_nearby();
        }
      }
      u.uprops[0x25].intrinsic = u.uprops[0x25].intrinsic & 0xfbffffff;
      if (u.uprops[0x25].intrinsic != 0 || u.uprops[0x25].extrinsic != 0) {
        uVar13 = mt_random();
        u.uprops[0x25].intrinsic = uVar13 % 0x14 + u.uprops[0x25].intrinsic + 1;
      }
      break;
    case 0x2f:
      make_vomiting(0,'\x01');
      break;
    default:
      if (lVar14 == 0x3a) {
        if ((delayed_killer != (char *)0x0) && (killer == (char *)0x0)) {
          killer = delayed_killer;
          delayed_killer = (char *)0x0;
        }
        if (killer == (char *)0x0) {
          killer_format = 2;
          killer = "turned into green slime";
        }
        iVar4 = 9;
        goto LAB_0025c14c;
      }
      if (lVar14 == 0x42) {
        see_monsters();
      }
    }
switchD_0025bc92_caseD_e:
    uVar12 = uVar12 + 0xc;
    lVar14 = lVar14 + 1;
    if (0x319a5b < uVar12) {
      run_timers();
      return;
    }
  } while( true );
}

Assistant:

void nh_timeout(void)
{
	struct prop *upp;
	int sleeptime;
	int m_idx;
	int baseluck = (flags.moonphase == FULL_MOON) ? 1 : 0;

	if (flags.friday13) baseluck -= 1;

	if (u.uluck != baseluck &&
		moves % (u.uhave.amulet || u.ugangr ? 300 : 600) == 0) {
	/* Cursed luckstones stop bad luck from timing out; blessed luckstones
	 * stop good luck from timing out; normal luckstones stop both;
	 * neither is stopped if you don't have a luckstone.
	 * Luck is based at 0 usually, +1 if a full moon and -1 on Friday 13th
	 */
	    int time_luck = stone_luck(FALSE);
	    boolean nostone = !carrying(LUCKSTONE) && !stone_luck(TRUE);

	    if (u.uluck > baseluck && (nostone || time_luck < 0))
		u.uluck--;
	    else if (u.uluck < baseluck && (nostone || time_luck > 0))
		u.uluck++;
	}
	if (Phasing) phasing_dialogue();
	if (u.uinvulnerable) return; /* things past this point could kill you */
	if (Stoned) stoned_dialogue();
	if (Slimed) slime_dialogue();
	if (Vomiting) vomiting_dialogue();
	if (Strangled) choke_dialogue();
	if (u.mtimedone && !--u.mtimedone) {
		if (Unchanging)
			u.mtimedone = rnd(100*youmonst.data->mlevel + 1);
		else
			rehumanize();
	}
	if (u.ucreamed) u.ucreamed--;

	/* Dissipate spell-based protection. */
	if (u.usptime) {
	    if (--u.usptime == 0 && u.uspellprot) {
		u.usptime = u.uspmtime;
		u.uspellprot--;
		find_ac();
		if (!Blind)
		    Norep("The %s haze around you %s.", hcolor("golden"),
			  u.uspellprot ? "becomes less dense" : "disappears");
	    }
	}

	if (u.ugallop) {
	    if (--u.ugallop == 0L && u.usteed)
	    	pline("%s stops galloping.", Monnam(u.usteed));
	}

	for (upp = u.uprops; upp < u.uprops+SIZE(u.uprops); upp++)
	    if ((upp->intrinsic & TIMEOUT) && !(--upp->intrinsic & TIMEOUT)) {
		switch(upp - u.uprops){
		case STONED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				/* leaving killer_format would make it
				   "petrified by petrification" */
				killer_format = NO_KILLER_PREFIX;
				killer = "killed by petrification";
			}
			done(STONING);
			break;
		case SLIMED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				killer_format = NO_KILLER_PREFIX;
				killer = "turned into green slime";
			}
			done(TURNED_SLIME);
			break;
		case VOMITING:
			make_vomiting(0L, TRUE);
			break;
		case SICK:
			pline("You die from your illness.");
			killer_format = KILLED_BY_AN;
			killer = u.usick_cause;
			if ((m_idx = name_to_mon(killer)) >= LOW_PM) {
			    if (type_is_pname(&mons[m_idx])) {
				killer_format = KILLED_BY;
			    } else if (mons[m_idx].geno & G_UNIQ) {
				killer = the(killer);
				strcpy(u.usick_cause, killer);
				killer_format = KILLED_BY;
			    }
			}
			u.usick_type = 0;
			done(POISONING);
			break;
		case FAST:
			if (!Very_fast)
				pline("You feel yourself slowing down%s.",
							Fast ? " a bit" : "");
			break;
		case CONFUSION:
			HConfusion = 1; /* So make_confused works properly */
			make_confused(0L, TRUE);
			stop_occupation();
			break;
		case STUNNED:
			HStun = 1;
			make_stunned(0L, TRUE);
			stop_occupation();
			break;
		case BLINDED:
			Blinded = 1;
			make_blinded(0L, TRUE);
			stop_occupation();
			break;
		case INVIS:
			newsym(u.ux,u.uy);
			if (!Invis && !BInvis && !Blind) {
			    pline(!See_invisible ?
				    "You are no longer invisible." :
				    "You can no longer see through yourself.");
			    stop_occupation();
			}
			break;
		case SEE_INVIS:
			set_mimic_blocking(); /* do special mimic handling */
			see_monsters();		/* make invis mons appear */
			newsym(u.ux,u.uy);	/* make self appear */
			stop_occupation();
			break;
		case WOUNDED_LEGS:
			heal_legs();
			stop_occupation();
			break;
		case HALLUC:
			HHallucination = 1;
			make_hallucinated(0L, TRUE, 0L);
			stop_occupation();
			break;
		case SLEEPING:
			if (unconscious() || FSleep_resistance) {
				HSleeping += rnd(100);
			} else if (Sleeping) {
				pline("You fall asleep.");
				sleeptime = rnd(PSleep_resistance ? 10 : 20);
				fall_asleep(-sleeptime, TRUE);
				HSleeping += sleeptime + rnd(100);
			}
			break;
		case LEVITATION:
			float_down(I_SPECIAL|TIMEOUT, 0L);
			break;
		case STRANGLED:
			killer_format = KILLED_BY;
			killer = (u.uburied) ? "suffocation" : "strangulation";
			done(DIED);
			break;
		case FUMBLING:
			/* call this only when a move took place.  */
			/* otherwise handle fumbling msgs locally. */
			if (u.umoved && !Levitation) {
			    slip_or_trip();
			    nomul(-2, "fumbling");
			    nomovemsg = "";
			    /* The more you are carrying the more likely you
			     * are to make noise when you fumble.  Adjustments
			     * to this number must be thoroughly play tested.
			     */
			    if ((inv_weight() > -500)) {
				pline("You make a lot of noise!");
				wake_nearby();
			    }
			}
			/* from outside means slippery ice; don't reset
			   counter if that's the only fumble reason */
			HFumbling &= ~FROMOUTSIDE;
			if (Fumbling)
			    HFumbling += rnd(20);
			break;
		case DETECT_MONSTERS:
			see_monsters();
			break;
		}
	}

	run_timers();
}